

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaUtil.c
# Opt level: O3

Vec_Int_t * Gia_ManGroupProve(Gia_Man_t *pInit,char *pCommLine,int nGroupSize,int fVerbose)

{
  undefined1 auVar1 [16];
  Vec_Ptr_t *pVVar2;
  int iVar3;
  Gia_Man_t *pGVar4;
  void *pvVar5;
  ulong uVar6;
  Vec_Int_t *pVVar7;
  int *piVar8;
  void **ppvVar9;
  Gia_Man_t *pNew;
  Vec_Int_t *pVVar10;
  Vec_Ptr_t *pVVar11;
  uint uVar12;
  long lVar14;
  ulong uVar15;
  int i;
  ulong uVar16;
  Abc_Frame_t *pAVar17;
  int i_1;
  int iVar18;
  ulong uVar19;
  uint uVar20;
  uint uVar21;
  double dVar22;
  undefined1 auVar23 [16];
  undefined1 auVar24 [16];
  undefined1 auVar25 [16];
  timespec ts;
  Vec_Ptr_t *vCexes;
  timespec local_a8;
  uint *local_98;
  Vec_Ptr_t *local_90;
  char *local_88;
  double local_80;
  long local_78;
  Abc_Frame_t *local_70;
  long local_68;
  long local_60;
  ulong local_58;
  Gia_Man_t *local_50;
  ulong local_48;
  ulong local_40;
  long local_38;
  uint uVar13;
  
  local_88 = pCommLine;
  local_70 = Abc_FrameReadGlobalFrame();
  pGVar4 = Gia_ManDup(pInit);
  iVar18 = 3;
  iVar3 = clock_gettime(3,&local_a8);
  if (iVar3 < 0) {
    local_78 = 1;
  }
  else {
    lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
    local_78 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_a8.tv_sec * -1000000;
  }
  if (nGroupSize < 1) {
    __assert_fail("nGroupSize > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x752,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (local_88 == (char *)0x0) {
    __assert_fail("pCommLine != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x753,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (pGVar4->nConstrs != 0) {
    __assert_fail("p->nConstrs == 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x754,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  pvVar5 = (void *)0x0;
  Abc_Print(iVar18,"RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n",
            (ulong)(uint)nGroupSize,local_88);
  iVar3 = pGVar4->nRegs;
  pVVar7 = pGVar4->vCos;
  uVar20 = pVVar7->nSize - iVar3;
  local_98 = (uint *)malloc(0x10);
  uVar21 = uVar20 - 1;
  uVar12 = 0x10;
  if (0xe < uVar21) {
    uVar12 = uVar20;
  }
  *local_98 = uVar12;
  if (uVar12 != 0) {
    pvVar5 = malloc((long)(int)uVar12 << 2);
  }
  *(void **)(local_98 + 2) = pvVar5;
  local_98[1] = uVar20;
  auVar1 = _DAT_0093d220;
  if (0 < (int)uVar20) {
    lVar14 = (ulong)uVar20 - 1;
    auVar23._8_4_ = (int)lVar14;
    auVar23._0_8_ = lVar14;
    auVar23._12_4_ = (int)((ulong)lVar14 >> 0x20);
    uVar6 = 0;
    auVar23 = auVar23 ^ _DAT_0093d220;
    auVar24 = _DAT_0093d210;
    do {
      auVar25 = auVar24 ^ auVar1;
      if ((bool)(~(auVar25._4_4_ == auVar23._4_4_ && auVar23._0_4_ < auVar25._0_4_ ||
                  auVar23._4_4_ < auVar25._4_4_) & 1)) {
        *(int *)((long)pvVar5 + uVar6 * 4) = (int)uVar6;
      }
      if ((auVar25._12_4_ != auVar23._12_4_ || auVar25._8_4_ <= auVar23._8_4_) &&
          auVar25._12_4_ <= auVar23._12_4_) {
        *(int *)((long)pvVar5 + uVar6 * 4 + 4) = (int)uVar6 + 1;
      }
      uVar6 = uVar6 + 2;
      lVar14 = auVar24._8_8_;
      auVar24._0_8_ = auVar24._0_8_ + 2;
      auVar24._8_8_ = lVar14 + 2;
    } while ((uVar20 + 1 & 0xfffffffe) != uVar6);
    uVar20 = pVVar7->nSize - iVar3;
    uVar21 = uVar20 - 1;
  }
  pVVar7 = (Vec_Int_t *)malloc(0x10);
  uVar12 = 0x10;
  if (0xe < uVar21) {
    uVar12 = uVar20;
  }
  pVVar7->nSize = 0;
  pVVar7->nCap = uVar12;
  if (uVar12 == 0) {
    piVar8 = (int *)0x0;
  }
  else {
    piVar8 = (int *)malloc((long)(int)uVar12 << 2);
  }
  pVVar7->pArray = piVar8;
  local_90 = (Vec_Ptr_t *)malloc(0x10);
  uVar12 = 8;
  if (6 < uVar21) {
    uVar12 = uVar20;
  }
  local_90->nSize = 0;
  local_90->nCap = uVar12;
  uVar21 = 0;
  if (uVar12 == 0) {
    ppvVar9 = (void **)0x0;
  }
  else {
    ppvVar9 = (void **)malloc((long)(int)uVar12 << 3);
  }
  local_90->pArray = ppvVar9;
  uVar13 = (uint)(0 < (int)uVar20 % nGroupSize);
  uVar12 = uVar13 + (int)uVar20 / nGroupSize;
  if (uVar12 == 0 || SCARRY4(uVar13,(int)uVar20 / nGroupSize) != (int)uVar12 < 0) {
    dVar22 = 0.0;
  }
  else {
    local_48 = (ulong)(uint)nGroupSize;
    lVar14 = 0;
    uVar6 = 0;
    local_58 = (ulong)uVar12;
    local_50 = pGVar4;
    do {
      iVar3 = local_50->vCos->nSize - local_50->nRegs;
      local_40 = uVar6 + 1;
      iVar18 = (int)(uVar6 * local_48);
      uVar21 = iVar3 - iVar18;
      if ((int)local_40 * nGroupSize < iVar3) {
        uVar21 = nGroupSize;
      }
      pGVar4 = local_50;
      local_38 = lVar14;
      pNew = Gia_ManDupCones(local_50,(int *)(uVar6 * local_48 * 4 + *(long *)(local_98 + 2)),uVar21
                             ,0);
      Abc_Print((int)pGVar4,"GROUP %4d : %4d <= PoId < %4d : ",uVar6 & 0xffffffff,
                (ulong)(uint)((int)uVar6 * nGroupSize),(ulong)(iVar18 + uVar21));
      pAVar17 = local_70;
      Abc_FrameUpdateGia(local_70,pNew);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_60 = 1;
      }
      else {
        lVar14 = SUB168(SEXT816(-0x20c49ba5e353f7cf) * SEXT816(local_a8.tv_nsec),8);
        local_60 = ((lVar14 >> 7) - (lVar14 >> 0x3f)) + local_a8.tv_sec * -1000000;
      }
      Cmd_CommandExecute(pAVar17,local_88);
      iVar3 = clock_gettime(3,&local_a8);
      if (iVar3 < 0) {
        local_68 = -1;
      }
      else {
        local_68 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
      }
      if (nGroupSize == 1) {
        iVar3 = Abc_FrameReadProbStatus(pAVar17);
        Vec_IntPush(pVVar7,iVar3);
        pVVar11 = local_90;
        pvVar5 = Abc_FrameReadCex(pAVar17);
        uVar21 = pVVar11->nSize;
        if (uVar21 == pVVar11->nCap) {
          if ((int)uVar21 < 0x10) {
            if (pVVar11->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc(0x80);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar11->pArray,0x80);
            }
            pVVar11->pArray = ppvVar9;
            pVVar11->nCap = 0x10;
          }
          else {
            if (pVVar11->pArray == (void **)0x0) {
              ppvVar9 = (void **)malloc((ulong)uVar21 << 4);
            }
            else {
              ppvVar9 = (void **)realloc(pVVar11->pArray,(ulong)uVar21 << 4);
            }
            pVVar11->pArray = ppvVar9;
            pVVar11->nCap = uVar21 * 2;
          }
        }
        else {
          ppvVar9 = pVVar11->pArray;
        }
        iVar3 = pVVar11->nSize;
        pVVar11->nSize = iVar3 + 1;
        ppvVar9[iVar3] = pvVar5;
      }
      else {
        pVVar10 = Abc_FrameReadPoStatuses(pAVar17);
        pVVar11 = Abc_FrameReadCexVec(pAVar17);
        if (pVVar10 == (Vec_Int_t *)0x0) {
          __assert_fail("vStatusCur != NULL",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                        ,0x771,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
        }
        if (0 < (int)uVar21) {
          local_80 = (double)(ulong)uVar21;
          uVar6 = 0;
          do {
            if ((long)pVVar10->nSize <= (long)uVar6) {
              __assert_fail("i >= 0 && i < p->nSize",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                            ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
            }
            Vec_IntPush(pVVar7,pVVar10->pArray[uVar6]);
            pVVar2 = local_90;
            if (pVVar11 == (Vec_Ptr_t *)0x0) {
              pvVar5 = (void *)0x0;
            }
            else {
              if ((long)pVVar11->nSize <= (long)uVar6) {
                __assert_fail("i >= 0 && i < p->nSize",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                              ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
              }
              pvVar5 = pVVar11->pArray[uVar6];
            }
            uVar21 = local_90->nSize;
            if (uVar21 == local_90->nCap) {
              if ((int)uVar21 < 0x10) {
                if (local_90->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc(0x80);
                }
                else {
                  ppvVar9 = (void **)realloc(local_90->pArray,0x80);
                }
                pVVar2->pArray = ppvVar9;
                pVVar2->nCap = 0x10;
              }
              else {
                if (local_90->pArray == (void **)0x0) {
                  ppvVar9 = (void **)malloc((ulong)uVar21 << 4);
                }
                else {
                  ppvVar9 = (void **)realloc(local_90->pArray,(ulong)uVar21 << 4);
                }
                pVVar2->pArray = ppvVar9;
                pVVar2->nCap = uVar21 * 2;
              }
            }
            else {
              ppvVar9 = local_90->pArray;
            }
            iVar3 = pVVar2->nSize;
            pVVar2->nSize = iVar3 + 1;
            ppvVar9[iVar3] = pvVar5;
            uVar6 = uVar6 + 1;
          } while (uVar6 < (ulong)local_80);
        }
      }
      lVar14 = local_38 + local_60 + local_68;
      uVar6 = local_40;
    } while (local_40 != local_58);
    uVar21 = local_90->nSize;
    uVar20 = local_50->vCos->nSize - local_50->nRegs;
    dVar22 = (double)lVar14;
    pGVar4 = local_50;
  }
  pVVar11 = local_90;
  if (uVar21 != uVar20) {
    __assert_fail("Vec_PtrSize(vCexes) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x77a,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  if (pVVar7->nSize != uVar21) {
    __assert_fail("Vec_IntSize(vOutMap) == Gia_ManPoNum(p)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaUtil.c"
                  ,0x77b,"Vec_Int_t *Gia_ManGroupProve(Gia_Man_t *, char *, int, int)");
  }
  uVar6 = (ulong)uVar21;
  if ((int)uVar21 < 1) {
    iVar3 = 0;
  }
  else {
    uVar15 = 0;
    iVar3 = 0;
    do {
      iVar3 = iVar3 + (uint)(local_90->pArray[uVar15] == (void *)0x0);
      uVar15 = uVar15 + 1;
    } while (uVar6 != uVar15);
  }
  local_80 = dVar22;
  if (iVar3 < (int)uVar21) {
    pAVar17 = local_70;
    Abc_FrameReplaceCexVec(local_70,&local_90);
    iVar3 = (int)pAVar17;
  }
  else {
    if (local_90->pArray != (void **)0x0) {
      free(local_90->pArray);
    }
    free(pVVar11);
    iVar3 = (int)pVVar11;
  }
  uVar12 = 0;
  Abc_Print(iVar3,"SUMMARY:  ");
  Abc_Print(iVar3,"Properties = %6d. ",(ulong)(uint)(pGVar4->vCos->nSize - pGVar4->nRegs));
  if ((int)uVar21 < 1) {
    Abc_Print(iVar3,"UNSAT = %6d. ",0);
    Abc_Print(iVar3,"SAT = %6d. ",0);
  }
  else {
    piVar8 = pVVar7->pArray;
    uVar15 = 0;
    uVar19 = 0;
    do {
      uVar19 = (ulong)((int)uVar19 + (uint)(piVar8[uVar15] == 1));
      uVar15 = uVar15 + 1;
    } while (uVar6 != uVar15);
    uVar16 = 0;
    Abc_Print(iVar3,"UNSAT = %6d. ",uVar19);
    uVar15 = 0;
    do {
      uVar15 = (ulong)((int)uVar15 + (uint)(piVar8[uVar16] == 0));
      uVar16 = uVar16 + 1;
    } while (uVar6 != uVar16);
    uVar19 = 0;
    Abc_Print(iVar3,"SAT = %6d. ",uVar15);
    uVar12 = 0;
    do {
      uVar12 = uVar12 + (piVar8[uVar19] == -1);
      uVar19 = uVar19 + 1;
    } while (uVar6 != uVar19);
  }
  Abc_Print(iVar3,"UNDEC = %6d. ",(ulong)uVar12);
  Abc_Print(iVar3,"\n");
  Abc_Print(iVar3,"%s =","Command time");
  Abc_Print(iVar3,"%9.2f sec\n",local_80 / 1000000.0);
  iVar18 = 3;
  iVar3 = clock_gettime(3,&local_a8);
  if (iVar3 < 0) {
    lVar14 = -1;
  }
  else {
    lVar14 = local_a8.tv_nsec / 1000 + local_a8.tv_sec * 1000000;
  }
  lVar14 = lVar14 + local_78;
  Abc_Print(iVar18,"%s =","Total time  ");
  Abc_Print(iVar18,"%9.2f sec\n",(double)lVar14 / 1000000.0);
  if (*(void **)(local_98 + 2) != (void *)0x0) {
    free(*(void **)(local_98 + 2));
  }
  free(local_98);
  Gia_ManStop(pGVar4);
  return pVVar7;
}

Assistant:

Vec_Int_t * Gia_ManGroupProve( Gia_Man_t * pInit, char * pCommLine, int nGroupSize, int fVerbose )
{
    Abc_Frame_t * pAbc = Abc_FrameReadGlobalFrame();
    Gia_Man_t * p = Gia_ManDup( pInit );
    Gia_Man_t * pGroup;
    Vec_Int_t * vOuts;
    Vec_Int_t * vOutMap;
    Vec_Ptr_t * vCexes;
    int i, k, nGroupCur, nGroups;
    abctime clk, timeComm = 0;
    abctime timeStart = Abc_Clock();
    // pre-conditions
    assert( nGroupSize > 0 );
    assert( pCommLine != NULL );
    assert( p->nConstrs == 0 );
    Abc_Print( 1, "RUNNING MultiProve: Group size = %d. Command line = \"%s\".\n", nGroupSize, pCommLine );
    // create output map
    vOuts   = Vec_IntStartNatural( Gia_ManPoNum(p) );
    vOutMap = Vec_IntAlloc( Gia_ManPoNum(p) );
    vCexes  = Vec_PtrAlloc( Gia_ManPoNum(p) );
    nGroups = Gia_ManPoNum(p) / nGroupSize + (int)((Gia_ManPoNum(p) % nGroupSize) > 0);
    for ( i = 0; i < nGroups; i++ )
    {
        // derive the group
        nGroupCur = ((i + 1) * nGroupSize < Gia_ManPoNum(p)) ? nGroupSize : Gia_ManPoNum(p) - i * nGroupSize;
        pGroup = Gia_ManDupCones( p, Vec_IntArray(vOuts) + i * nGroupSize, nGroupCur, 0 );
        Abc_Print( 1, "GROUP %4d : %4d <= PoId < %4d : ", i, i * nGroupSize, i * nGroupSize + nGroupCur );
        // set the current GIA
        Abc_FrameUpdateGia( pAbc, pGroup );
        // solve the group
        clk = Abc_Clock();
        Cmd_CommandExecute( pAbc, pCommLine );
        timeComm += Abc_Clock() - clk;
        // get the solution status
        if ( nGroupSize == 1 )
        {
            Vec_IntPush( vOutMap, Abc_FrameReadProbStatus(pAbc) );
            Vec_PtrPush( vCexes, Abc_FrameReadCex(pAbc) );
        }
        else // if ( nGroupSize > 1 )  
        {
            Vec_Int_t * vStatusCur = Abc_FrameReadPoStatuses( pAbc );
            Vec_Ptr_t * vCexesCur = Abc_FrameReadCexVec( pAbc );
            assert( vStatusCur != NULL ); // only works for "bmc3" and "pdr"
//            assert( vCexesCur != NULL );
            for ( k = 0; k < nGroupCur; k++ )
            {
                Vec_IntPush( vOutMap, Vec_IntEntry(vStatusCur, k) );
                Vec_PtrPush( vCexes, vCexesCur ? Vec_PtrEntry(vCexesCur, k) : NULL );
            }
        }
    }
    assert( Vec_PtrSize(vCexes) == Gia_ManPoNum(p) );
    assert( Vec_IntSize(vOutMap) == Gia_ManPoNum(p) );
    // set CEXes
    if ( Vec_PtrCountZero(vCexes) < Vec_PtrSize(vCexes) )
        Abc_FrameReplaceCexVec( pAbc, &vCexes );
    else  // there is no CEXes
        Vec_PtrFree( vCexes );
    // report the result
    Abc_Print( 1, "SUMMARY:  " );
    Abc_Print( 1, "Properties = %6d. ", Gia_ManPoNum(p) );
    Abc_Print( 1, "UNSAT = %6d. ",      Vec_IntCountEntry(vOutMap, 1) );
    Abc_Print( 1, "SAT = %6d. ",        Vec_IntCountEntry(vOutMap, 0) );
    Abc_Print( 1, "UNDEC = %6d. ",      Vec_IntCountEntry(vOutMap, -1) );
    Abc_Print( 1, "\n" );
    Abc_PrintTime( 1, "Command time", timeComm );
    Abc_PrintTime( 1, "Total time  ", Abc_Clock() - timeStart );
    // cleanup
    Vec_IntFree( vOuts );
    Gia_ManStop( p );
    return vOutMap;
}